

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::ScriptContext::GenerateRootFunction
          (ScriptContext *this,ParseNodeProg *parseTree,uint sourceIndex,Parser *parser,
          uint32 grfscr,CompileScriptException *pse,char16 *rootDisplayName)

{
  code *pcVar1;
  bool bVar2;
  Utf8SourceInfo *pUVar3;
  undefined4 *puVar4;
  JavascriptFunction *rootFunction;
  ParseableFunctionInfo *body;
  LPCUTF8 source;
  CompileScriptException *pCStack_40;
  HRESULT hr;
  CompileScriptException *pse_local;
  Parser *pPStack_30;
  uint32 grfscr_local;
  Parser *parser_local;
  ParseNodeProg *pPStack_20;
  uint sourceIndex_local;
  ParseNodeProg *parseTree_local;
  ScriptContext *this_local;
  
  pCStack_40 = pse;
  pse_local._4_4_ = grfscr;
  pPStack_30 = parser;
  parser_local._4_4_ = sourceIndex;
  pPStack_20 = parseTree;
  parseTree_local = (ParseNodeProg *)this;
  pUVar3 = GetSource(this,sourceIndex);
  body = (ParseableFunctionInfo *)
         Utf8SourceInfo::GetSource(pUVar3,L"ScriptContext::GenerateRootFunction");
  if (body == (ParseableFunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa3d,"(source != nullptr)","source != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  rootFunction = (JavascriptFunction *)0x0;
  source._4_4_ = GenerateByteCode(pPStack_20,pse_local._4_4_,this,
                                  (ParseableFunctionInfo **)&rootFunction,parser_local._4_4_,false,
                                  pPStack_30,pCStack_40,(ScopeInfo *)0x0,(ScriptFunction **)0x0);
  pUVar3 = GetSource(this,parser_local._4_4_);
  Utf8SourceInfo::SetByteCodeGenerationFlags(pUVar3,pse_local._4_4_);
  if (source._4_4_ < 0) {
    this_local = (ScriptContext *)0x0;
  }
  else {
    ParseableFunctionInfo::SetDisplayName((ParseableFunctionInfo *)rootFunction,rootDisplayName);
    FunctionProxy::SetIsTopLevel((FunctionProxy *)rootFunction,true);
    this_local = (ScriptContext *)
                 JavascriptLibrary::CreateScriptFunction
                           ((this->super_ScriptContextBase).javascriptLibrary,
                            (FunctionProxy *)rootFunction);
  }
  return (JavascriptFunction *)this_local;
}

Assistant:

JavascriptFunction* ScriptContext::GenerateRootFunction(ParseNodeProg * parseTree, uint sourceIndex, Parser* parser, uint32 grfscr, CompileScriptException * pse, const char16 *rootDisplayName)
    {
        HRESULT hr;

        // Get the source code to keep it alive during the bytecode generation process
        LPCUTF8 source = this->GetSource(sourceIndex)->GetSource(_u("ScriptContext::GenerateRootFunction"));
        Assert(source != nullptr); // Source should not have been reclaimed by now

        // Generate bytecode and native code
        ParseableFunctionInfo* body = NULL;
        hr = GenerateByteCode(parseTree, grfscr, this, &body, sourceIndex, false, parser, pse);

        this->GetSource(sourceIndex)->SetByteCodeGenerationFlags(grfscr);
        if(FAILED(hr))
        {
            return nullptr;
        }

        body->SetDisplayName(rootDisplayName);
        body->SetIsTopLevel(true);

        JavascriptFunction* rootFunction = javascriptLibrary->CreateScriptFunction(body);
        return rootFunction;
    }